

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O0

void __thiscall HEkkPrimal::updateDual(HEkkPrimal *this)

{
  double dVar1;
  value_type vVar2;
  int iVar3;
  long lVar4;
  reference pvVar5;
  reference pvVar6;
  vector<double,_std::allocator<double>_> *this_00;
  long *in_RDI;
  HighsInt iCol_1;
  HighsInt iRow;
  HighsInt iEl_1;
  HighsInt iCol;
  HighsInt iEl;
  vector<double,_std::allocator<double>_> *workDual;
  value_type in_stack_ffffffffffffffb8;
  HighsSimplexAnalysis *in_stack_ffffffffffffffc0;
  int local_1c;
  int local_14;
  
  HighsSimplexAnalysis::simplexTimerStart
            (in_stack_ffffffffffffffc0,(HighsInt)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
             SUB84(in_stack_ffffffffffffffb8,0));
  this_00 = (vector<double,_std::allocator<double>_> *)(*in_RDI + 0x2578);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     (this_00,(long)*(int *)((long)in_RDI + 0x44));
  in_RDI[0xb] = (long)(*pvVar5 / (double)in_RDI[0xe]);
  for (local_14 = 0; local_14 < *(int *)((long)in_RDI + 0x2ac); local_14 = local_14 + 1) {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x56),(long)local_14);
    iVar3 = *pvVar6;
    in_stack_ffffffffffffffc0 = (HighsSimplexAnalysis *)in_RDI[0xb];
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x59),(long)iVar3);
    dVar1 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)iVar3);
    *pvVar5 = -(double)in_stack_ffffffffffffffc0 * dVar1 + *pvVar5;
  }
  for (local_1c = 0; local_1c < *(int *)((long)in_RDI + 0x1fc); local_1c = local_1c + 1) {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_1c);
    iVar3 = *pvVar6;
    lVar4 = in_RDI[2];
    dVar1 = (double)in_RDI[0xb];
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x43),(long)iVar3);
    in_stack_ffffffffffffffb8 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       (this_00,(long)(iVar3 + (int)lVar4));
    *pvVar5 = -dVar1 * in_stack_ffffffffffffffb8 + *pvVar5;
  }
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     (this_00,(long)*(int *)((long)in_RDI + 0x44));
  *pvVar5 = 0.0;
  vVar2 = (value_type)in_RDI[0xb];
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)(int)in_RDI[10]);
  *pvVar5 = -vVar2;
  HEkk::invalidateDualInfeasibilityRecord((HEkk *)0x7ae0a0);
  *(undefined1 *)(*in_RDI + 0x255b) = 0;
  HighsSimplexAnalysis::simplexTimerStop
            (in_stack_ffffffffffffffc0,(HighsInt)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
             SUB84(in_stack_ffffffffffffffb8,0));
  return;
}

Assistant:

void HEkkPrimal::updateDual() {
  analysis->simplexTimerStart(UpdateDualClock);
  assert(alpha_col);
  assert(row_out >= 0);
  vector<double>& workDual = ekk_instance_.info_.workDual_;
  //  const vector<HighsInt>& nonbasicMove =
  //  ekk_instance_.basis_.nonbasicMove_;
  // Update the duals
  theta_dual = workDual[variable_in] / alpha_col;
  for (HighsInt iEl = 0; iEl < row_ap.count; iEl++) {
    HighsInt iCol = row_ap.index[iEl];
    workDual[iCol] -= theta_dual * row_ap.array[iCol];
  }
  for (HighsInt iEl = 0; iEl < row_ep.count; iEl++) {
    HighsInt iRow = row_ep.index[iEl];
    HighsInt iCol = iRow + num_col;
    workDual[iCol] -= theta_dual * row_ep.array[iRow];
  }
  // Dual for the pivot
  workDual[variable_in] = 0;
  workDual[variable_out] = -theta_dual;

  ekk_instance_.invalidateDualInfeasibilityRecord();
  // After dual update in primal simplex the dual objective value is not known
  ekk_instance_.status_.has_dual_objective_value = false;
  analysis->simplexTimerStop(UpdateDualClock);
}